

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O1

bool GGUFMeta::GKV<bool>::set(gguf_context *ctx,int k,bool *target,llama_model_kv_override *ovrd)

{
  bool bVar1;
  
  bVar1 = validate_override(LLAMA_KV_OVERRIDE_TYPE_BOOL,ovrd);
  if (bVar1) {
    bVar1 = (ovrd->field_2).val_bool;
  }
  else {
    if (k < 0) {
      return false;
    }
    bVar1 = get_kv(ctx,k);
  }
  *target = bVar1;
  return true;
}

Assistant:

static bool set(const gguf_context * ctx, const int k, T & target, const struct llama_model_kv_override * ovrd = nullptr) {
            if (try_override<T>(target, ovrd)) {
                return true;
            }
            if (k < 0) { return false; }
            target = get_kv(ctx, k);
            return true;
        }